

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD3Importer::ValidateHeaderOffsets(MD3Importer *this)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  Header *pHVar4;
  Logger *this_00;
  runtime_error *prVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = this->pcHeader->IDENT;
  if ((uVar1 != 0x33504449) && (uVar1 != 0x49445033)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid MD3 file: Magic bytes not found","");
    std::runtime_error::runtime_error(prVar5,(string *)local_40);
    *(undefined ***)prVar5 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0xf < this->pcHeader->VERSION) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Unsupported MD3 file version. Continuing happily ...");
  }
  pHVar4 = this->pcHeader;
  uVar2 = pHVar4->NUM_SURFACES;
  if ((ulong)uVar2 == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid md3 file: NUM_SURFACES is 0","");
    std::runtime_error::runtime_error(prVar5,(string *)local_40);
    *(undefined ***)prVar5 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = this->fileSize;
  if (((uVar3 <= pHVar4->OFS_FRAMES) || (uVar3 <= pHVar4->OFS_SURFACES)) ||
     (uVar3 < pHVar4->OFS_EOF)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid MD3 header: some offsets are outside the file","");
    std::runtime_error::runtime_error(prVar5,(string *)local_40);
    *(undefined ***)prVar5 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x25ed09 < uVar2) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid MD3 header: too many surfaces, would overflow","");
    std::runtime_error::runtime_error(prVar5,(string *)local_40);
    *(undefined ***)prVar5 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)pHVar4->OFS_SURFACES + (ulong)uVar2 * 0x6c < (ulong)uVar3) {
    if (this->configFrameID < pHVar4->NUM_FRAMES) {
      return;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"The requested frame is not existing the file","");
    std::runtime_error::runtime_error(prVar5,(string *)local_40);
    *(undefined ***)prVar5 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Invalid MD3 header: some surfaces are outside the file","");
  std::runtime_error::runtime_error(prVar5,(string *)local_40);
  *(undefined ***)prVar5 = &PTR__runtime_error_007fd498;
  __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MD3Importer::ValidateHeaderOffsets()
{
    // Check magic number
    if (pcHeader->IDENT != AI_MD3_MAGIC_NUMBER_BE &&
        pcHeader->IDENT != AI_MD3_MAGIC_NUMBER_LE)
            throw DeadlyImportError( "Invalid MD3 file: Magic bytes not found");

    // Check file format version
    if (pcHeader->VERSION > 15)
        ASSIMP_LOG_WARN( "Unsupported MD3 file version. Continuing happily ...");

    // Check some offset values whether they are valid
    if (!pcHeader->NUM_SURFACES)
        throw DeadlyImportError( "Invalid md3 file: NUM_SURFACES is 0");

    if (pcHeader->OFS_FRAMES >= fileSize || pcHeader->OFS_SURFACES >= fileSize ||
        pcHeader->OFS_EOF > fileSize) {
        throw DeadlyImportError("Invalid MD3 header: some offsets are outside the file");
    }

	if (pcHeader->NUM_SURFACES > AI_MAX_ALLOC(MD3::Surface)) {
        throw DeadlyImportError("Invalid MD3 header: too many surfaces, would overflow");
	}

    if (pcHeader->OFS_SURFACES + pcHeader->NUM_SURFACES * sizeof(MD3::Surface) >= fileSize) {
        throw DeadlyImportError("Invalid MD3 header: some surfaces are outside the file");
    }

    if (pcHeader->NUM_FRAMES <= configFrameID )
        throw DeadlyImportError("The requested frame is not existing the file");
}